

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_fastcgi_module.c
# Opt level: O3

char * ngx_http_fastcgi_lowat_check(ngx_conf_t *cf,void *post,void *data)

{
  ngx_conf_log_error(5,cf,0,"\"fastcgi_send_lowat\" is not supported, ignored");
  *(undefined8 *)data = 0;
  return (char *)0x0;
}

Assistant:

static char *
ngx_http_fastcgi_lowat_check(ngx_conf_t *cf, void *post, void *data)
{
#if (NGX_FREEBSD)
    ssize_t *np = data;

    if ((u_long) *np >= ngx_freebsd_net_inet_tcp_sendspace) {
        ngx_conf_log_error(NGX_LOG_EMERG, cf, 0,
                           "\"fastcgi_send_lowat\" must be less than %d "
                           "(sysctl net.inet.tcp.sendspace)",
                           ngx_freebsd_net_inet_tcp_sendspace);

        return NGX_CONF_ERROR;
    }

#elif !(NGX_HAVE_SO_SNDLOWAT)
    ssize_t *np = data;

    ngx_conf_log_error(NGX_LOG_WARN, cf, 0,
                       "\"fastcgi_send_lowat\" is not supported, ignored");

    *np = 0;

#endif

    return NGX_CONF_OK;
}